

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 utf8::
 utf16to8<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,std::back_insert_iterator<std::__cxx11::string>>
           (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> start,
           __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> end,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           result)

{
  ushort *puVar1;
  ushort uVar2;
  undefined8 *puVar3;
  uint32_t cp;
  ushort uVar4;
  
  do {
    if (start._M_current == end._M_current) {
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )result.container;
    }
    puVar1 = (ushort *)start._M_current + 1;
    uVar2 = *start._M_current;
    cp = (uint32_t)uVar2;
    uVar4 = uVar2;
    if ((uVar2 & 0xfc00) == 0xd800) {
      if (puVar1 == (ushort *)end._M_current) {
LAB_0056221b:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = &PTR__exception_00822100;
        *(ushort *)(puVar3 + 1) = uVar4;
        __cxa_throw(puVar3,&invalid_utf16::typeinfo,std::exception::~exception);
      }
      uVar4 = *puVar1;
      if ((uVar4 & 0xfc00) != 0xdc00) goto LAB_0056221b;
      start._M_current = start._M_current + 2;
      cp = (uint)uVar2 * 0x400 + (uint)uVar4 + 0xfca02400;
    }
    else {
      start._M_current = (short *)puVar1;
      if ((uVar2 & 0xfc00) == 0xdc00) goto LAB_0056221b;
    }
    result = append<std::back_insert_iterator<std::__cxx11::string>>(cp,result);
  } while( true );
}

Assistant:

octet_iterator utf16to8 (u16bit_iterator start, u16bit_iterator end, octet_iterator result)
    {
        while (start != end) {
            uint32_t cp = utf8::internal::mask16(*start++);
            // Take care of surrogate pairs first
            if (utf8::internal::is_lead_surrogate(cp)) {
                if (start != end) {
                    uint32_t trail_surrogate = utf8::internal::mask16(*start++);
                    if (utf8::internal::is_trail_surrogate(trail_surrogate))
                        cp = (cp << 10) + trail_surrogate + internal::SURROGATE_OFFSET;
                    else
                        throw invalid_utf16(static_cast<uint16_t>(trail_surrogate));
                }
                else
                    throw invalid_utf16(static_cast<uint16_t>(cp));

            }
            // Lone trail surrogate
            else if (utf8::internal::is_trail_surrogate(cp))
                throw invalid_utf16(static_cast<uint16_t>(cp));

            result = utf8::append(cp, result);
        }
        return result;
    }